

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O1

void __thiscall
llm_build_llama::llm_build_llama
          (llm_build_llama *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  float fVar1;
  uint uVar2;
  llama_hparams *plVar3;
  llama_memory_i *plVar4;
  pointer plVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *pgVar8;
  char *pcVar9;
  undefined8 uVar10;
  long lVar11;
  int il;
  long lVar12;
  bool bVar13;
  ggml_tensor *in_stack_ffffffffffffff28;
  undefined4 uVar14;
  float local_7c;
  ggml_tensor *local_70;
  int local_60;
  undefined4 local_5c;
  ggml_tensor *local_58;
  ggml_tensor *local_50;
  ggml_cgraph *local_48;
  undefined8 local_40;
  llm_graph_input_attn_kv_unified *local_38;
  
  local_48 = gf;
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  plVar3 = (this->super_llm_graph_context).hparams;
  uVar2 = plVar3->n_embd_head_v;
  if (uVar2 == plVar3->n_embd_head_k) {
    if (uVar2 == plVar3->n_rot) {
      local_70 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
      local_50 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
      if ((this->super_llm_graph_context).arch == LLM_ARCH_LLAMA4) {
        local_58 = llm_graph_context::build_inp_attn_scale(&this->super_llm_graph_context);
      }
      else {
        local_58 = (ggml_tensor *)0x0;
      }
      local_38 = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
      local_7c = ((this->super_llm_graph_context).hparams)->f_attention_scale;
      if ((local_7c == 0.0) && (!NAN(local_7c))) {
        local_7c = (float)uVar2;
        if (local_7c < 0.0) {
          local_7c = sqrtf(local_7c);
        }
        else {
          local_7c = SQRT(local_7c);
        }
        local_7c = 1.0 / local_7c;
      }
      if (0 < (this->super_llm_graph_context).n_layer) {
        lVar11 = 0;
        lVar12 = 0;
        do {
          uVar14 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
          bVar13 = true;
          il = (int)lVar12;
          if ((this->super_llm_graph_context).arch == LLM_ARCH_LLAMA4) {
            bVar13 = (il + 1U) % ((this->super_llm_graph_context).hparams)->n_no_rope_layer_step !=
                     0;
          }
          pgVar6 = llm_graph_context::build_norm
                             (&this->super_llm_graph_context,local_70,
                              *(ggml_tensor **)
                               ((long)&((model->layers).
                                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->attn_norm +
                               lVar11),(ggml_tensor *)0x0,LLM_NORM_RMS,il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"attn_norm",il);
          plVar4 = (this->super_llm_graph_context).memory;
          local_5c = (undefined4)(this->super_llm_graph_context).n_ctx_per_seq;
          local_60 = il;
          if (plVar4[10]._vptr_llama_memory_i == (_func_int **)0x0) {
            std::__throw_bad_function_call();
          }
          local_40 = (*(code *)plVar4[0xb]._vptr_llama_memory_i)(plVar4 + 8,&local_5c,&local_60);
          pgVar7 = llm_graph_context::build_lora_mm
                             (&this->super_llm_graph_context,
                              *(ggml_tensor **)
                               ((long)&((model->layers).
                                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->wq + lVar11),
                              pgVar6);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"Qcur",il);
          if (*(long *)((long)&((model->layers).
                                super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                _M_impl.super__Vector_impl_data._M_start)->bq + lVar11) != 0) {
            pgVar7 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar7);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"Qcur",il);
          }
          pgVar8 = llm_graph_context::build_lora_mm
                             (&this->super_llm_graph_context,
                              *(ggml_tensor **)
                               ((long)&((model->layers).
                                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->wk + lVar11),
                              pgVar6);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Kcur",il);
          if (*(long *)((long)&((model->layers).
                                super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                _M_impl.super__Vector_impl_data._M_start)->bk + lVar11) != 0) {
            pgVar8 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar8);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Kcur",il);
          }
          pgVar6 = llm_graph_context::build_lora_mm
                             (&this->super_llm_graph_context,
                              *(ggml_tensor **)
                               ((long)&((model->layers).
                                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->wv + lVar11),
                              pgVar6);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Vcur",il);
          if (*(long *)((long)&((model->layers).
                                super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                _M_impl.super__Vector_impl_data._M_start)->bv + lVar11) != 0) {
            pgVar6 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar6);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Vcur",il);
          }
          pgVar7 = (ggml_tensor *)
                   ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar7,uVar2,
                                   (this->super_llm_graph_context).n_head,
                                   (long)(this->super_llm_graph_context).n_tokens);
          pgVar8 = (ggml_tensor *)
                   ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar8,uVar2,
                                   (this->super_llm_graph_context).n_head_kv,
                                   (long)(this->super_llm_graph_context).n_tokens);
          pgVar6 = (ggml_tensor *)
                   ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar6,uVar2,
                                   (this->super_llm_graph_context).n_head_kv,
                                   (long)(this->super_llm_graph_context).n_tokens);
          if (bVar13) {
            pgVar7 = (ggml_tensor *)
                     ggml_rope_ext((this->super_llm_graph_context).freq_base,
                                   (this->super_llm_graph_context).freq_scale,
                                   (this->super_llm_graph_context).ext_factor,
                                   (this->super_llm_graph_context).attn_factor,
                                   (this->super_llm_graph_context).beta_fast,
                                   (this->super_llm_graph_context).beta_slow,
                                   (this->super_llm_graph_context).ctx0,pgVar7,local_50,local_40,
                                   (int)(this->super_llm_graph_context).n_rot,
                                   (this->super_llm_graph_context).rope_type,
                                   CONCAT44(uVar14,(this->super_llm_graph_context).n_ctx_orig));
            pgVar8 = (ggml_tensor *)
                     ggml_rope_ext((this->super_llm_graph_context).freq_base,
                                   (this->super_llm_graph_context).freq_scale,
                                   (this->super_llm_graph_context).ext_factor,
                                   (this->super_llm_graph_context).attn_factor,
                                   (this->super_llm_graph_context).beta_fast,
                                   (this->super_llm_graph_context).beta_slow,
                                   (this->super_llm_graph_context).ctx0,pgVar8,local_50,local_40,
                                   (int)(this->super_llm_graph_context).n_rot,
                                   (this->super_llm_graph_context).rope_type,
                                   (this->super_llm_graph_context).n_ctx_orig);
          }
          else if (local_58 != (ggml_tensor *)0x0) {
            pgVar7 = (ggml_tensor *)ggml_mul((this->super_llm_graph_context).ctx0,pgVar7);
          }
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"Qcur",il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Kcur",il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Vcur",il);
          if ((bVar13 && (this->super_llm_graph_context).arch == LLM_ARCH_LLAMA4) &&
             (plVar3 = (this->super_llm_graph_context).hparams, plVar3->use_kq_norm == true)) {
            pgVar7 = (ggml_tensor *)
                     ggml_rms_norm(plVar3->f_norm_rms_eps,(this->super_llm_graph_context).ctx0,
                                   pgVar7);
            pgVar8 = (ggml_tensor *)
                     ggml_rms_norm(((this->super_llm_graph_context).hparams)->f_norm_rms_eps,
                                   (this->super_llm_graph_context).ctx0,pgVar8);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"Qcur_normed",il);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Kcur_normed",il);
          }
          plVar5 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pgVar6 = llm_graph_context::build_attn
                             (&this->super_llm_graph_context,local_38,local_48,
                              *(ggml_tensor **)((long)&plVar5->wo + lVar11),
                              *(ggml_tensor **)((long)&plVar5->bo + lVar11),pgVar7,pgVar8,pgVar6,
                              (ggml_tensor *)0x0,(ggml_tensor *)0x0,local_7c,il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"attn_out",il);
          if (lVar12 == (this->super_llm_graph_context).n_layer + -1) {
            pgVar7 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
            pgVar6 = (ggml_tensor *)
                     ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar6,pgVar7);
            local_70 = (ggml_tensor *)
                       ggml_get_rows((this->super_llm_graph_context).ctx0,local_70,pgVar7);
          }
          fVar1 = ((this->super_llm_graph_context).hparams)->f_residual_scale;
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            pgVar6 = (ggml_tensor *)ggml_scale((this->super_llm_graph_context).ctx0,pgVar6);
          }
          pgVar7 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar6,local_70);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"ffn_inp",il);
          plVar5 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (*(long *)((long)&plVar5->ffn_gate_inp + lVar11) == 0) {
            pgVar6 = llm_graph_context::build_norm
                               (&this->super_llm_graph_context,pgVar7,
                                *(ggml_tensor **)((long)&plVar5->ffn_norm + lVar11),
                                (ggml_tensor *)0x0,LLM_NORM_RMS,il);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"ffn_norm",il);
            plVar5 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            in_stack_ffffffffffffff28 = *(ggml_tensor **)((long)&plVar5->ffn_gate_b + lVar11);
            pgVar6 = llm_graph_context::build_ffn
                               (&this->super_llm_graph_context,pgVar6,
                                *(ggml_tensor **)((long)&plVar5->ffn_up + lVar11),
                                *(ggml_tensor **)((long)&plVar5->ffn_up_b + lVar11),
                                (ggml_tensor *)0x0,
                                *(ggml_tensor **)((long)&plVar5->ffn_gate + lVar11),
                                in_stack_ffffffffffffff28,(ggml_tensor *)0x0,
                                *(ggml_tensor **)((long)&plVar5->ffn_down + lVar11),
                                *(ggml_tensor **)((long)&plVar5->ffn_down_b + lVar11),
                                (ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_SILU,LLM_FFN_PAR,il);
            llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"ffn_out",il);
          }
          else {
            pgVar8 = *(ggml_tensor **)((long)&plVar5->ffn_norm + lVar11);
            if ((this->super_llm_graph_context).arch == LLM_ARCH_LLAMA4) {
              pgVar8 = llm_graph_context::build_norm
                                 (&this->super_llm_graph_context,pgVar7,pgVar8,(ggml_tensor *)0x0,
                                  LLM_NORM_RMS,il);
              llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"ffn_norm",il);
              plVar5 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pgVar6 = llm_graph_context::build_moe_ffn
                                 (&this->super_llm_graph_context,pgVar8,
                                  *(ggml_tensor **)((long)&plVar5->ffn_gate_inp + lVar11),
                                  *(ggml_tensor **)((long)&plVar5->ffn_up_exps + lVar11),
                                  *(ggml_tensor **)((long)&plVar5->ffn_gate_exps + lVar11),
                                  *(ggml_tensor **)((long)&plVar5->ffn_down_exps + lVar11),
                                  (ggml_tensor *)0x0,(this->super_llm_graph_context).n_expert,
                                  (this->super_llm_graph_context).n_expert_used,LLM_FFN_SILU,false,
                                  false,0.0,LLAMA_EXPERT_GATING_FUNC_TYPE_SIGMOID,il);
              plVar5 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              in_stack_ffffffffffffff28 = (ggml_tensor *)0x0;
              pgVar8 = llm_graph_context::build_ffn
                                 (&this->super_llm_graph_context,pgVar8,
                                  *(ggml_tensor **)((long)&plVar5->ffn_up_shexp + lVar11),
                                  (ggml_tensor *)0x0,(ggml_tensor *)0x0,
                                  *(ggml_tensor **)((long)&plVar5->ffn_gate_shexp + lVar11),
                                  (ggml_tensor *)0x0,(ggml_tensor *)0x0,
                                  *(ggml_tensor **)((long)&plVar5->ffn_down_shexp + lVar11),
                                  (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,
                                  LLM_FFN_SILU,LLM_FFN_PAR,il);
              llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"ffn_moe_shexp",il);
              pgVar6 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar6,pgVar8);
              llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"ffn_moe_out_merged",il);
            }
            else {
              pgVar6 = llm_graph_context::build_norm
                                 (&this->super_llm_graph_context,pgVar7,pgVar8,(ggml_tensor *)0x0,
                                  LLM_NORM_RMS,il);
              llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"ffn_norm",il);
              plVar5 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              in_stack_ffffffffffffff28 = (ggml_tensor *)0x0;
              pgVar6 = llm_graph_context::build_moe_ffn
                                 (&this->super_llm_graph_context,pgVar6,
                                  *(ggml_tensor **)((long)&plVar5->ffn_gate_inp + lVar11),
                                  *(ggml_tensor **)((long)&plVar5->ffn_up_exps + lVar11),
                                  *(ggml_tensor **)((long)&plVar5->ffn_gate_exps + lVar11),
                                  *(ggml_tensor **)((long)&plVar5->ffn_down_exps + lVar11),
                                  (ggml_tensor *)0x0,(this->super_llm_graph_context).n_expert,
                                  (this->super_llm_graph_context).n_expert_used,LLM_FFN_SILU,true,
                                  false,0.0,LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX,il);
              llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"ffn_moe_out",il);
            }
          }
          fVar1 = ((this->super_llm_graph_context).hparams)->f_residual_scale;
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            pgVar6 = (ggml_tensor *)ggml_scale((this->super_llm_graph_context).ctx0,pgVar6);
          }
          pgVar6 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar6,pgVar7);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"ffn_out",il);
          local_70 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar6,il);
          llm_graph_context::cb(&this->super_llm_graph_context,local_70,"l_out",il);
          lVar12 = lVar12 + 1;
          lVar11 = lVar11 + 0x4f0;
        } while (lVar12 < (this->super_llm_graph_context).n_layer);
      }
      pgVar6 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,local_70,model->output_norm,
                          (ggml_tensor *)0x0,LLM_NORM_RMS,-1);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"result_norm",-1);
      ((this->super_llm_graph_context).res._M_t.
       super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
       super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
       super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar6;
      pgVar6 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar6)
      ;
      fVar1 = ((this->super_llm_graph_context).hparams)->f_logit_scale;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        pgVar6 = (ggml_tensor *)ggml_scale(1.0 / fVar1,(this->super_llm_graph_context).ctx0,pgVar6);
      }
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"result_output",-1);
      ((this->super_llm_graph_context).res._M_t.
       super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
       super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
       super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar6;
      ggml_build_forward_expand(local_48,pgVar6);
      return;
    }
    pcVar9 = "n_embd_head == hparams.n_rot";
    uVar10 = 0x1148;
  }
  else {
    pcVar9 = "n_embd_head == hparams.n_embd_head_k";
    uVar10 = 0x1147;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,uVar10,"GGML_ASSERT(%s) failed",pcVar9);
}

Assistant:

llm_build_llama(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        // temperature tuning
        ggml_tensor * inp_attn_scale = nullptr;
        if (arch == LLM_ARCH_LLAMA4) {
            inp_attn_scale = build_inp_attn_scale();
        }

        auto * inp_attn = build_attn_inp_kv_unified();

        const float kq_scale = hparams.f_attention_scale == 0.0f ? 1.0f/sqrtf(float(n_embd_head)) : hparams.f_attention_scale;
        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            bool use_rope = arch == LLM_ARCH_LLAMA4
                ? (il + 1) % hparams.n_no_rope_layer_step != 0
                : true;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                // rope freq factors for llama3; may return nullptr for llama2 and other models
                ggml_tensor * rope_factors = static_cast<const llama_kv_cache_unified *>(memory)->cbs.get_rope_factors(n_ctx_per_seq, il);

                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);
                if (model.layers[il].bq) {
                    Qcur = ggml_add(ctx0, Qcur, model.layers[il].bq);
                    cb(Qcur, "Qcur", il);
                }

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);
                if (model.layers[il].bk) {
                    Kcur = ggml_add(ctx0, Kcur, model.layers[il].bk);
                    cb(Kcur, "Kcur", il);
                }

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);
                if (model.layers[il].bv) {
                    Vcur = ggml_add(ctx0, Vcur, model.layers[il].bv);
                    cb(Vcur, "Vcur", il);
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                if (use_rope) {
                    Qcur = ggml_rope_ext(
                            ctx0, Qcur, inp_pos, rope_factors,
                            n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                            ext_factor, attn_factor, beta_fast, beta_slow
                            );

                    Kcur = ggml_rope_ext(
                            ctx0, Kcur, inp_pos, rope_factors,
                            n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                            ext_factor, attn_factor, beta_fast, beta_slow
                            );
                } else if (inp_attn_scale) {
                    Qcur = ggml_mul(ctx0, Qcur, inp_attn_scale);
                }

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                if (arch == LLM_ARCH_LLAMA4 && use_rope && hparams.use_kq_norm) {
                    // Llama4TextL2Norm
                    Qcur = ggml_rms_norm(ctx0, Qcur, hparams.f_norm_rms_eps);
                    Kcur = ggml_rms_norm(ctx0, Kcur, hparams.f_norm_rms_eps);
                    cb(Qcur, "Qcur_normed", il);
                    cb(Kcur, "Kcur_normed", il);
                }

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, kq_scale, il);
                cb(cur, "attn_out", il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            // For Granite architecture
            if (hparams.f_residual_scale) {
                cur = ggml_scale(ctx0, cur, hparams.f_residual_scale);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network (non-MoE)
            if (model.layers[il].ffn_gate_inp == nullptr) {

                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);

                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   model.layers[il].ffn_up_b,   NULL,
                        model.layers[il].ffn_gate, model.layers[il].ffn_gate_b, NULL,
                        model.layers[il].ffn_down, model.layers[il].ffn_down_b, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);

            } else if (arch == LLM_ARCH_LLAMA4) {
                // llama4 MoE
                ggml_tensor * ffn_inp_normed = build_norm(ffn_inp,
                        model.layers[il].ffn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);

                ggml_tensor * moe_out = build_moe_ffn(ffn_inp_normed,
                        model.layers[il].ffn_gate_inp,
                        model.layers[il].ffn_up_exps,
                        model.layers[il].ffn_gate_exps,
                        model.layers[il].ffn_down_exps,
                        nullptr,
                        n_expert, n_expert_used,
                        LLM_FFN_SILU, false,
                        false, 0.0,
                        LLAMA_EXPERT_GATING_FUNC_TYPE_SIGMOID,
                        il);

                // Shared experts
                ggml_tensor * shexp_out = build_ffn(ffn_inp_normed,
                    model.layers[il].ffn_up_shexp,   NULL, NULL,
                    model.layers[il].ffn_gate_shexp, NULL, NULL,
                    model.layers[il].ffn_down_shexp, NULL, NULL,
                    NULL,
                    LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(shexp_out, "ffn_moe_shexp", il);

                cur = ggml_add(ctx0, moe_out, shexp_out);
                cb(cur, "ffn_moe_out_merged", il);

            } else {
                // MoE branch
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);

                cur = build_moe_ffn(cur,
                        model.layers[il].ffn_gate_inp,
                        model.layers[il].ffn_up_exps,
                        model.layers[il].ffn_gate_exps,
                        model.layers[il].ffn_down_exps,
                        nullptr,
                        n_expert, n_expert_used,
                        LLM_FFN_SILU, true,
                        false, 0.0,
                        LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX,
                        il);
                cb(cur, "ffn_moe_out", il);
            }

            // For Granite architecture
            if (hparams.f_residual_scale) {
                cur = ggml_scale(ctx0, cur, hparams.f_residual_scale);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);
            cb(cur, "ffn_out", il);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        // For Granite architecture
        if (hparams.f_logit_scale) {
            cur = ggml_scale(ctx0, cur, 1.0f / hparams.f_logit_scale);
        }

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }